

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

void __thiscall Image_GetSetY_Test::TestBody(Image_GetSetY_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_02;
  Point2i p;
  WrapMode2D wrapMode;
  Point2i p_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  Point2i p_01;
  Point2i resolution;
  WrapMode2D wrapMode_00;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int *piVar4;
  char *pcVar5;
  reference pvVar6;
  int iVar7;
  Float FVar8;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ImageChannelValues cv;
  Float v;
  int x_1;
  int y_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ImageChannelDesc yDesc;
  int x;
  int y;
  Image image;
  PixelFormat format;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<pbrt::PixelFormat> *__range1;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> yPixels;
  Point2i res;
  ImageChannelValues *in_stack_fffffffffffff868;
  Float in_stack_fffffffffffff870;
  undefined4 in_stack_fffffffffffff874;
  undefined4 in_stack_fffffffffffff878;
  WrapMode in_stack_fffffffffffff87c;
  undefined4 in_stack_fffffffffffff880;
  Float in_stack_fffffffffffff884;
  reference in_stack_fffffffffffff888;
  undefined4 in_stack_fffffffffffff890;
  int in_stack_fffffffffffff894;
  int *in_stack_fffffffffffff898;
  allocator<char> *in_stack_fffffffffffff8a0;
  Message *in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8b0;
  float in_stack_fffffffffffff8b4;
  Message *in_stack_fffffffffffff8d0;
  Message *in_stack_fffffffffffff8d8;
  Float in_stack_fffffffffffff8e0;
  int in_stack_fffffffffffff8e4;
  float in_stack_fffffffffffff8e8;
  float in_stack_fffffffffffff8ec;
  int in_stack_fffffffffffff8f0;
  WrapMode in_stack_fffffffffffff8f4;
  Float in_stack_fffffffffffff8f8;
  int in_stack_fffffffffffff8fc;
  int in_stack_fffffffffffff900;
  int in_stack_fffffffffffff904;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff908;
  float *in_stack_fffffffffffff920;
  undefined7 in_stack_fffffffffffff928;
  char *in_stack_fffffffffffff938;
  Image *in_stack_fffffffffffff948;
  char *in_stack_fffffffffffff950;
  undefined7 in_stack_fffffffffffff958;
  undefined1 in_stack_fffffffffffff95f;
  array<pbrt::WrapMode,_2> in_stack_fffffffffffff960;
  ColorEncodingHandle *in_stack_fffffffffffff980;
  PixelFormat in_stack_fffffffffffff98c;
  Image *in_stack_fffffffffffff990;
  Allocator in_stack_fffffffffffff998;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff9a0;
  undefined7 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b7;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *desc;
  Image *this_00;
  undefined7 in_stack_fffffffffffff9d0;
  Tuple2<pbrt::Point2,_int> p_02;
  string *local_5d8;
  string *local_550;
  AssertionResult local_518;
  float local_4fc;
  undefined4 local_4f0;
  float local_4ec;
  AssertionResult local_4e8 [2];
  AssertionResult local_4c8 [2];
  char *local_4a8;
  undefined4 local_49c;
  AssertionResult local_498 [6];
  AssertionResult local_438 [2];
  WrapMode local_418 [2];
  undefined4 local_40c;
  AssertionResult local_408 [2];
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_3e8;
  Float local_3a4;
  int local_3a0;
  int local_39c;
  string local_398 [54];
  undefined1 local_362;
  allocator<char> local_361;
  Tuple2<pbrt::Point2,_int> local_360;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> local_358 [2];
  AssertionResult local_2e8;
  string local_2d8 [48];
  AssertionResult local_2a8;
  undefined1 local_292;
  allocator<char> local_291;
  string *local_290;
  string local_288 [32];
  string *local_268;
  undefined8 local_260;
  int local_210;
  int local_20c;
  ImageChannelValues *local_208;
  undefined1 local_1f5;
  allocator<char> local_1e1;
  string *local_1e0;
  string local_1d8 [32];
  string *local_1b8;
  undefined8 local_1b0;
  Tuple2<pbrt::Point2,_int> local_198;
  PixelFormat local_74;
  const_iterator local_70;
  const_iterator local_68;
  PixelFormat local_5c [3];
  initializer_list<pbrt::PixelFormat> local_50;
  initializer_list<pbrt::PixelFormat> *local_40;
  Tuple2<pbrt::Point2,_int> local_38;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_30;
  Tuple2<pbrt::Point2,_int> local_10 [2];
  
  pbrt::Point2<int>::Point2
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
             (int)((ulong)in_stack_fffffffffffff868 >> 0x20),(int)in_stack_fffffffffffff868);
  local_38 = local_10[0];
  GetFloatPixels((Point2i)in_stack_fffffffffffff908,in_stack_fffffffffffff904);
  local_5c[0] = U256;
  local_5c[1] = 1;
  local_5c[2] = 2;
  local_50._M_array = local_5c;
  local_50._M_len = 3;
  local_40 = &local_50;
  local_68 = std::initializer_list<pbrt::PixelFormat>::begin(local_40);
  local_70 = std::initializer_list<pbrt::PixelFormat>::end
                       ((initializer_list<pbrt::PixelFormat> *)
                        CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
  for (; local_68 != local_70; local_68 = local_68 + 1) {
    local_74 = *local_68;
    local_198 = local_10[0];
    local_1f5 = 1;
    local_1e0 = local_1d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (char *)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    local_1f5 = 0;
    local_1b8 = local_1d8;
    local_1b0 = 1;
    v_00._M_array._4_4_ = in_stack_fffffffffffff87c;
    v_00._M_array._0_4_ = in_stack_fffffffffffff878;
    v_00._M_len._0_4_ = in_stack_fffffffffffff880;
    v_00._M_len._4_4_ = in_stack_fffffffffffff884;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),v_00);
    pbrt::ColorEncodingHandle::ColorEncodingHandle
              ((ColorEncodingHandle *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
               (ColorEncodingHandle *)in_stack_fffffffffffff868);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)
               CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
    resolution.super_Tuple2<pbrt::Point2,_int>.y._3_1_ = in_stack_fffffffffffff9b7;
    resolution.super_Tuple2<pbrt::Point2,_int>._0_7_ = in_stack_fffffffffffff9b0;
    in_stack_fffffffffffff868 = local_208;
    pbrt::Image::Image(in_stack_fffffffffffff990,in_stack_fffffffffffff98c,resolution,
                       in_stack_fffffffffffff9a0,in_stack_fffffffffffff980,in_stack_fffffffffffff998
                      );
    local_550 = (string *)&local_1b8;
    do {
      local_550 = local_550 + -0x20;
      std::__cxx11::string::~string(local_550);
    } while (local_550 != local_1d8);
    std::allocator<char>::~allocator(&local_1e1);
    for (local_20c = 0; iVar7 = local_20c,
        piVar4 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,1), iVar7 < *piVar4;
        local_20c = local_20c + 1) {
      for (local_210 = 0; iVar7 = local_210,
          piVar4 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0), iVar7 < *piVar4;
          local_210 = local_210 + 1) {
        pbrt::Point2<int>::Point2
                  ((Point2<int> *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                   (int)((ulong)in_stack_fffffffffffff868 >> 0x20),(int)in_stack_fffffffffffff868);
        iVar7 = local_20c;
        piVar4 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                  (&local_30,(long)(iVar7 * *piVar4 + local_210));
        p.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff8f4;
        p.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff8f0;
        pbrt::Image::SetChannel
                  ((Image *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),p,
                   in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0);
      }
    }
    local_292 = 1;
    local_290 = local_288;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (char *)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    local_292 = 0;
    local_268 = local_288;
    local_260 = 1;
    v_01._M_array._4_4_ = in_stack_fffffffffffff87c;
    v_01._M_array._0_4_ = in_stack_fffffffffffff878;
    v_01._M_len._0_4_ = in_stack_fffffffffffff880;
    v_01._M_len._4_4_ = in_stack_fffffffffffff884;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),v_01);
    requestedChannels.n._0_7_ = in_stack_fffffffffffff958;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         in_stack_fffffffffffff950;
    requestedChannels.n._7_1_ = in_stack_fffffffffffff95f;
    pbrt::Image::GetChannelDesc(in_stack_fffffffffffff948,requestedChannels);
    local_5d8 = (string *)&local_268;
    do {
      local_5d8 = local_5d8 + -0x20;
      std::__cxx11::string::~string(local_5d8);
    } while (local_5d8 != local_288);
    std::allocator<char>::~allocator(&local_291);
    pbrt::ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x5bbb70);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
               SUB81((ulong)in_stack_fffffffffffff868 >> 0x38,0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                 (char *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                 (char *)in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff8a0,
                 (Type)((ulong)in_stack_fffffffffffff898 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                 (int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                 (Message *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
      std::__cxx11::string::~string(local_2d8);
      testing::Message::~Message((Message *)0x5bbd8c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5bbe07);
    local_362 = 1;
    p_02 = (Tuple2<pbrt::Point2,_int>)local_358;
    local_360 = p_02;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (char *)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    local_362 = 0;
    local_358[0].nAlloc = (size_t)local_358;
    local_358[0].nStored = 1;
    v_02._M_array._4_4_ = in_stack_fffffffffffff87c;
    v_02._M_array._0_4_ = in_stack_fffffffffffff878;
    v_02._M_len._0_4_ = in_stack_fffffffffffff880;
    v_02._M_len._4_4_ = in_stack_fffffffffffff884;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),v_02);
    requestedChannels_00.n._0_7_ = in_stack_fffffffffffff958;
    requestedChannels_00.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         in_stack_fffffffffffff950;
    requestedChannels_00.n._7_1_ = in_stack_fffffffffffff95f;
    pbrt::Image::GetChannelDesc(in_stack_fffffffffffff948,requestedChannels_00);
    uVar2 = pbrt::ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x5bbed1);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
               SUB81((ulong)in_stack_fffffffffffff868 >> 0x38,0));
    pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x5bbf05);
    desc = local_358;
    this_00 = (Image *)&local_358[0].nAlloc;
    do {
      this_00 = (Image *)((long)this_00 + 0xffffffffffffffd0U + 0x10);
      std::__cxx11::string::~string((string *)this_00);
    } while (this_00 != (Image *)desc);
    std::allocator<char>::~allocator(&local_361);
    in_stack_fffffffffffff9b7 = testing::AssertionResult::operator_cast_to_bool(&local_2e8);
    if (!(bool)in_stack_fffffffffffff9b7) {
      testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                 (char *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                 (char *)in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff8a0,
                 (Type)((ulong)in_stack_fffffffffffff898 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                 (int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                 (Message *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
      std::__cxx11::string::~string(local_398);
      testing::Message::~Message((Message *)0x5bc17a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5bc1f5);
    for (local_39c = 0; iVar7 = local_39c,
        in_stack_fffffffffffff980 =
             (ColorEncodingHandle *)pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,1),
        iVar7 < (int)(in_stack_fffffffffffff980->
                     super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                     ).bits; local_39c = local_39c + 1) {
      local_3a0 = 0;
      while (iVar7 = local_3a0, piVar4 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0),
            iVar7 < *piVar4) {
        pbrt::Point2<int>::Point2
                  ((Point2<int> *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                   (int)((ulong)in_stack_fffffffffffff868 >> 0x20),(int)in_stack_fffffffffffff868);
        pbrt::WrapMode2D::WrapMode2D
                  ((WrapMode2D *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                   in_stack_fffffffffffff87c);
        p_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff900;
        p_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff8fc;
        wrapMode.wrap.values[1] = (WrapMode)in_stack_fffffffffffff8f8;
        wrapMode.wrap.values[0] = in_stack_fffffffffffff8f4;
        FVar8 = pbrt::Image::GetChannel
                          ((Image *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                           p_00,in_stack_fffffffffffff8e4,wrapMode);
        local_3a4 = FVar8;
        pbrt::Point2<int>::Point2
                  ((Point2<int> *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                   (int)((ulong)in_stack_fffffffffffff868 >> 0x20),(int)in_stack_fffffffffffff868);
        pbrt::WrapMode2D::WrapMode2D
                  ((WrapMode2D *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                   in_stack_fffffffffffff87c);
        p_01.super_Tuple2<pbrt::Point2,_int>.y = iVar7;
        p_01.super_Tuple2<pbrt::Point2,_int>.x = (int)FVar8;
        pbrt::Image::GetChannels
                  ((Image *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),p_01,
                   (WrapMode2D)in_stack_fffffffffffff960.values);
        local_40c = 1;
        in_stack_fffffffffffff960.values =
             (WrapMode  [2])
             pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::size
                       (&local_3e8);
        local_418 = in_stack_fffffffffffff960.values;
        testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                  ((char *)in_stack_fffffffffffff888,
                   (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                   (int *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
        in_stack_fffffffffffff95f = testing::AssertionResult::operator_cast_to_bool(local_408);
        if (!(bool)in_stack_fffffffffffff95f) {
          testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
          in_stack_fffffffffffff950 =
               testing::AssertionResult::failure_message((AssertionResult *)0x5bc436);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffff8a0,
                     (Type)((ulong)in_stack_fffffffffffff898 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                     (int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                     (Message *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
          testing::Message::~Message((Message *)0x5bc499);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5bc4ee);
        in_stack_fffffffffffff948 =
             (Image *)pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                      operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                                 (size_type)in_stack_fffffffffffff868);
        testing::internal::EqHelper<false>::Compare<float,float>
                  ((char *)in_stack_fffffffffffff888,
                   (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                   (float *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
                   (float *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_438);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
          in_stack_fffffffffffff938 =
               testing::AssertionResult::failure_message((AssertionResult *)0x5bc5a5);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffff8a0,
                     (Type)((ulong)in_stack_fffffffffffff898 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                     (int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                     (Message *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
          testing::Message::~Message((Message *)0x5bc608);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5bc660);
        pbrt::Point2<int>::Point2
                  ((Point2<int> *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                   (int)((ulong)in_stack_fffffffffffff868 >> 0x20),(int)in_stack_fffffffffffff868);
        pbrt::WrapMode2D::WrapMode2D
                  ((WrapMode2D *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                   in_stack_fffffffffffff87c);
        wrapMode_00.wrap.values[1]._3_1_ = uVar2;
        wrapMode_00.wrap.values._0_7_ = in_stack_fffffffffffff9d0;
        pbrt::Image::GetChannels(this_00,(Point2i)p_02,(ImageChannelDesc *)desc,wrapMode_00);
        pbrt::ImageChannelValues::operator=
                  ((ImageChannelValues *)
                   CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                   in_stack_fffffffffffff868);
        pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x5bc6e4);
        local_49c = 1;
        pcVar5 = (char *)pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                         size(&local_3e8);
        local_4a8 = pcVar5;
        testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                  ((char *)in_stack_fffffffffffff888,
                   (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                   (int *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
        uVar3 = testing::AssertionResult::operator_cast_to_bool(local_498);
        if (!(bool)uVar3) {
          testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
          in_stack_fffffffffffff920 =
               (float *)testing::AssertionResult::failure_message((AssertionResult *)0x5bc7d8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffff8a0,
                     (Type)((ulong)in_stack_fffffffffffff898 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                     (int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                     (Message *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
          testing::Message::~Message((Message *)0x5bc83b);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5bc890);
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                   CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                   (size_type)in_stack_fffffffffffff868);
        testing::internal::EqHelper<false>::Compare<float,float>
                  ((char *)in_stack_fffffffffffff888,
                   (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                   (float *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
                   (float *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4c8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
          testing::AssertionResult::failure_message((AssertionResult *)0x5bc947);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffff8a0,
                     (Type)((ulong)in_stack_fffffffffffff898 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                     (int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                     (Message *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
          testing::Message::~Message((Message *)0x5bc9aa);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5bca02);
        if (local_74 == U256) {
          in_stack_fffffffffffff8f8 = local_3a4;
          in_stack_fffffffffffff8fc = local_39c;
          piVar4 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0);
          in_stack_fffffffffffff900 = (int)piVar4;
          pvVar6 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                             (&local_30,(long)(in_stack_fffffffffffff8fc * *piVar4 + local_3a0));
          in_stack_fffffffffffff8f0 = (int)pvVar6;
          in_stack_fffffffffffff8f4 = (WrapMode)((ulong)pvVar6 >> 0x20);
          iVar7 = 0;
          in_stack_fffffffffffff8ec = pbrt::Clamp<float,int,int>(*pvVar6,0,1);
          in_stack_fffffffffffff8e8 = in_stack_fffffffffffff8f8 - in_stack_fffffffffffff8ec;
          std::abs(iVar7);
          local_4f0 = 0x3b00c24b;
          local_4ec = in_stack_fffffffffffff8e8;
          testing::internal::CmpHelperLT<float,float>
                    (in_stack_fffffffffffff938,pcVar5,
                     (float *)CONCAT17(uVar3,in_stack_fffffffffffff928),in_stack_fffffffffffff920);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4e8);
          in_stack_fffffffffffff8e4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff8e4);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
            in_stack_fffffffffffff8d8 =
                 testing::Message::operator<<
                           ((Message *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870)
                            ,(float *)in_stack_fffffffffffff868);
            in_stack_fffffffffffff8d0 =
                 testing::Message::operator<<
                           ((Message *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870)
                            ,(char (*) [5])in_stack_fffffffffffff868);
            iVar7 = local_39c;
            piVar4 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0);
            pvVar6 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                               (&local_30,(long)(iVar7 * *piVar4 + local_3a0));
            in_stack_fffffffffffff8b4 = pbrt::Clamp<float,int,int>(*pvVar6,0,1);
            local_4fc = in_stack_fffffffffffff8b4;
            in_stack_fffffffffffff8a8 =
                 testing::Message::operator<<
                           ((Message *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870)
                            ,(float *)in_stack_fffffffffffff868);
            in_stack_fffffffffffff8a0 =
                 (allocator<char> *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x5bcc44);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffff8a0,
                       (Type)((ulong)in_stack_fffffffffffff898 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                       (int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0)
                       ,(Message *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870)
                      );
            testing::Message::~Message((Message *)0x5bcc9e);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x5bccf3);
        }
        else {
          in_stack_fffffffffffff894 = local_39c;
          in_stack_fffffffffffff898 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0);
          in_stack_fffffffffffff888 =
               pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (&local_30,
                          (long)(in_stack_fffffffffffff894 * *in_stack_fffffffffffff898 + local_3a0)
                         );
          in_stack_fffffffffffff884 =
               modelQuantization(in_stack_fffffffffffff870,
                                 (PixelFormat)((ulong)in_stack_fffffffffffff868 >> 0x20));
          testing::internal::EqHelper<false>::Compare<float,float>
                    ((char *)in_stack_fffffffffffff888,
                     (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                     (float *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
                     (float *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_518);
          in_stack_fffffffffffff880 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff880);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x5bce09);
            in_stack_fffffffffffff878 = SUB84(pcVar5,0);
            in_stack_fffffffffffff87c = (WrapMode)((ulong)pcVar5 >> 0x20);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffff8a0,
                       (Type)((ulong)in_stack_fffffffffffff898 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                       (int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0)
                       ,(Message *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870)
                      );
            testing::Message::~Message((Message *)0x5bce66);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x5bcebb);
        }
        pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x5bced9);
        local_3a0 = local_3a0 + 1;
      }
    }
    pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x5bcf23);
    pbrt::Image::~Image((Image *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
  return;
}

Assistant:

TEST(Image, GetSetY) {
    Point2i res(9, 3);
    pstd::vector<float> yPixels = GetFloatPixels(res, 1);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"Y"}, ColorEncodingHandle::Linear);
        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                image.SetChannel({x, y}, 0, yPixels[y * res[0] + x]);
            }

        ImageChannelDesc yDesc = image.GetChannelDesc({"Y"});
        EXPECT_TRUE(bool(yDesc));
        EXPECT_FALSE(bool(image.GetChannelDesc({"Y0L0"})));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                Float v = image.GetChannel({x, y}, 0);
                ImageChannelValues cv = image.GetChannels({x, y});
                EXPECT_EQ(1, cv.size());
                EXPECT_EQ(v, cv[0]);

                cv = image.GetChannels({x, y}, yDesc);
                EXPECT_EQ(1, cv.size());
                EXPECT_EQ(v, cv[0]);

                if (format == PixelFormat::U256)
                    EXPECT_LT(std::abs(v - Clamp(yPixels[y * res[0] + x], 0, 1)),
                              0.501f / 255.f)
                        << v << " vs " << Clamp(yPixels[y * res[0] + x], 0, 1);
                else
                    EXPECT_EQ(v, modelQuantization(yPixels[y * res[0] + x], format));
            }
    }
}